

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveColumnWriter::FinalizeWrite(PrimitiveColumnWriter *this,ColumnWriterState *state_p)

{
  bool bVar1;
  PrimitiveColumnWriterState *pPVar2;
  optional_ptr<duckdb::ColumnWriterStatistics,_true> writer_stats;
  ParquetWriter *this_00;
  idx_t col_idx;
  ulong uVar3;
  reference pPVar4;
  unsigned_long uVar5;
  long lVar6;
  long lVar7;
  pointer pCVar8;
  long *in_RDI;
  ColumnChunk *in_stack_00000040;
  PrimitiveColumnWriterState *in_stack_00000048;
  PrimitiveColumnWriter *in_stack_00000050;
  idx_t header_start_offset;
  PageWriteInformation *write_info;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::PageWriteInformation,_true> *__range1;
  idx_t total_uncompressed_size;
  idx_t start_offset;
  BufferedFileWriter *column_writer;
  value_type *column_chunk;
  PrimitiveColumnWriterState *state;
  vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
  *in_stack_ffffffffffffff38;
  ColumnWriterState *in_stack_ffffffffffffff40;
  TBase *in_stack_ffffffffffffff60;
  ParquetWriter *in_stack_ffffffffffffff68;
  PrimitiveColumnWriterState *in_stack_ffffffffffffff70;
  optional_ptr<duckdb::ColumnWriterStatistics,_true> in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff8c;
  const_data_ptr_t in_stack_ffffffffffffff90;
  ParquetWriter *in_stack_ffffffffffffff98;
  __normal_iterator<duckdb::PageWriteInformation_*,_std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>_>
  in_stack_ffffffffffffffb8;
  PrimitiveColumnWriter *in_stack_ffffffffffffffc0;
  ColumnChunk *column;
  
  pPVar2 = ColumnWriterState::Cast<duckdb::PrimitiveColumnWriterState>(in_stack_ffffffffffffff40);
  writer_stats.ptr =
       (ColumnWriterStatistics *)
       vector<duckdb_parquet::ColumnChunk,_true>::operator[]
                 ((vector<duckdb_parquet::ColumnChunk,_true> *)in_stack_ffffffffffffff40,
                  (size_type)in_stack_ffffffffffffff38);
  FlushPage(in_stack_ffffffffffffffc0,
            (PrimitiveColumnWriterState *)in_stack_ffffffffffffffb8._M_current);
  this_00 = (ParquetWriter *)ParquetWriter::GetWriter((ParquetWriter *)0x86e895);
  col_idx = duckdb::BufferedFileWriter::GetTotalWritten();
  uVar3 = (**(code **)(*in_RDI + 0x80))(in_RDI,pPVar2);
  if ((uVar3 & 1) != 0) {
    uVar5 = (**(code **)(*in_RDI + 0x88))(in_RDI,pPVar2);
    lVar7 = UnsafeNumericCast<long,unsigned_long,void>(uVar5);
    (((reference)writer_stats.ptr)->meta_data).statistics.distinct_count = lVar7;
    (((reference)writer_stats.ptr)->meta_data).statistics.__isset =
         (_Statistics__isset)
         ((byte)(((reference)writer_stats.ptr)->meta_data).statistics.__isset & 0xf7 | 8);
    uVar5 = duckdb::BufferedFileWriter::GetTotalWritten();
    lVar7 = UnsafeNumericCast<long,unsigned_long,void>(uVar5);
    (((reference)writer_stats.ptr)->meta_data).dictionary_page_offset = lVar7;
    (((reference)writer_stats.ptr)->meta_data).__isset =
         (_ColumnMetaData__isset)
         ((byte)(((reference)writer_stats.ptr)->meta_data).__isset & 0xfb | 4);
    in_stack_ffffffffffffff70 = pPVar2;
    pCVar8 = std::
             unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>_>
             ::get((unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>_>
                    *)in_stack_ffffffffffffff40);
    (**(code **)(*in_RDI + 0x90))(in_RDI,in_stack_ffffffffffffff70,pCVar8);
  }
  (((reference)writer_stats.ptr)->meta_data).data_page_offset = 0;
  SetParquetStatistics(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  column = (ColumnChunk *)0x0;
  std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>::begin
            (in_stack_ffffffffffffff38);
  std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>::end
            (in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::PageWriteInformation_*,_std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>_>
                             *)in_stack_ffffffffffffff40,
                            (__normal_iterator<duckdb::PageWriteInformation_*,_std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>_>
                             *)in_stack_ffffffffffffff38), bVar1) {
    pPVar4 = __gnu_cxx::
             __normal_iterator<duckdb::PageWriteInformation_*,_std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>_>
             ::operator*((__normal_iterator<duckdb::PageWriteInformation_*,_std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>_>
                          *)&stack0xffffffffffffffb8);
    if (((((reference)writer_stats.ptr)->meta_data).data_page_offset == 0) &&
       (((pPVar4->page_header).type == DATA_PAGE || ((pPVar4->page_header).type == DATA_PAGE_V2))))
    {
      uVar5 = duckdb::BufferedFileWriter::GetTotalWritten();
      lVar7 = UnsafeNumericCast<long,unsigned_long,void>(uVar5);
      (((reference)writer_stats.ptr)->meta_data).data_page_offset = lVar7;
    }
    lVar7 = duckdb::BufferedFileWriter::GetTotalWritten();
    ParquetWriter::Write(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    lVar6 = duckdb::BufferedFileWriter::GetTotalWritten();
    column = (ColumnChunk *)
             ((long)column + (long)(pPVar4->page_header).uncompressed_page_size + (lVar6 - lVar7));
    ParquetWriter::WriteData
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    __gnu_cxx::
    __normal_iterator<duckdb::PageWriteInformation_*,_std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>_>
    ::operator++((__normal_iterator<duckdb::PageWriteInformation_*,_std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>_>
                  *)&stack0xffffffffffffffb8);
  }
  lVar7 = duckdb::BufferedFileWriter::GetTotalWritten();
  lVar7 = UnsafeNumericCast<long,unsigned_long,void>(lVar7 - col_idx);
  (((reference)writer_stats.ptr)->meta_data).total_compressed_size = lVar7;
  lVar7 = UnsafeNumericCast<long,unsigned_long,void>((unsigned_long)column);
  (((reference)writer_stats.ptr)->meta_data).total_uncompressed_size = lVar7;
  pPVar2->row_group->total_byte_size =
       (((reference)writer_stats.ptr)->meta_data).total_uncompressed_size +
       pPVar2->row_group->total_byte_size;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>_>
                      *)0x86ebb1);
  if (bVar1) {
    unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>::
    unique_ptr((unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>
                *)in_stack_ffffffffffffff40,
               (unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>
                *)in_stack_ffffffffffffff38);
    ParquetWriter::BufferBloomFilter
              ((ParquetWriter *)in_stack_ffffffffffffff80.ptr,(idx_t)in_RDI,
               (unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>
                *)in_stack_ffffffffffffff70);
    unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>
                 *)0x86ec0f);
  }
  pCVar8 = std::
           unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>_>
           ::get((unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>_>
                  *)in_RDI[1]);
  optional_ptr<duckdb::ColumnWriterStatistics,_true>::optional_ptr
            ((optional_ptr<duckdb::ColumnWriterStatistics,_true> *)&stack0xffffffffffffff80,pCVar8);
  ParquetWriter::FlushColumnStats(this_00,col_idx,column,writer_stats);
  return;
}

Assistant:

void PrimitiveColumnWriter::FinalizeWrite(ColumnWriterState &state_p) {
	auto &state = state_p.Cast<PrimitiveColumnWriterState>();
	auto &column_chunk = state.row_group.columns[state.col_idx];

	// flush the last page (if any remains)
	FlushPage(state);

	auto &column_writer = writer.GetWriter();
	auto start_offset = column_writer.GetTotalWritten();
	// flush the dictionary
	if (HasDictionary(state)) {
		column_chunk.meta_data.statistics.distinct_count = UnsafeNumericCast<int64_t>(DictionarySize(state));
		column_chunk.meta_data.statistics.__isset.distinct_count = true;
		column_chunk.meta_data.dictionary_page_offset = UnsafeNumericCast<int64_t>(column_writer.GetTotalWritten());
		column_chunk.meta_data.__isset.dictionary_page_offset = true;
		FlushDictionary(state, state.stats_state.get());
	}

	// record the start position of the pages for this column
	column_chunk.meta_data.data_page_offset = 0;
	SetParquetStatistics(state, column_chunk);

	// write the individual pages to disk
	idx_t total_uncompressed_size = 0;
	for (auto &write_info : state.write_info) {
		// set the data page offset whenever we see the *first* data page
		if (column_chunk.meta_data.data_page_offset == 0 && (write_info.page_header.type == PageType::DATA_PAGE ||
		                                                     write_info.page_header.type == PageType::DATA_PAGE_V2)) {
			column_chunk.meta_data.data_page_offset = UnsafeNumericCast<int64_t>(column_writer.GetTotalWritten());
		}
		D_ASSERT(write_info.page_header.uncompressed_page_size > 0);
		auto header_start_offset = column_writer.GetTotalWritten();
		writer.Write(write_info.page_header);
		// total uncompressed size in the column chunk includes the header size (!)
		total_uncompressed_size += column_writer.GetTotalWritten() - header_start_offset;
		total_uncompressed_size += write_info.page_header.uncompressed_page_size;
		writer.WriteData(write_info.compressed_data, write_info.compressed_size);
	}
	column_chunk.meta_data.total_compressed_size =
	    UnsafeNumericCast<int64_t>(column_writer.GetTotalWritten() - start_offset);
	column_chunk.meta_data.total_uncompressed_size = UnsafeNumericCast<int64_t>(total_uncompressed_size);
	state.row_group.total_byte_size += column_chunk.meta_data.total_uncompressed_size;

	if (state.bloom_filter) {
		writer.BufferBloomFilter(state.col_idx, std::move(state.bloom_filter));
	}

	// finalize the stats
	writer.FlushColumnStats(state.col_idx, column_chunk, state.stats_state.get());
}